

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O0

void ncnn::matmul_transb(Mat *A,Mat *B,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  int local_90;
  float local_8c;
  int k;
  float sum;
  float *ptrB;
  int j;
  float *outptr;
  float *ptrA;
  int i;
  float *pOut;
  float *pB;
  float *pA;
  int N;
  int K;
  int M;
  Option *opt_local;
  Mat *top_blob_local;
  Mat *B_local;
  Mat *A_local;
  
  iVar1 = A->h;
  iVar2 = A->w;
  iVar3 = B->h;
  pvVar4 = A->data;
  pvVar5 = B->data;
  pvVar6 = top_blob->data;
  for (outptr._4_4_ = 0; outptr._4_4_ < iVar1; outptr._4_4_ = outptr._4_4_ + 1) {
    ptrB = (float *)((long)pvVar6 + (long)(outptr._4_4_ * iVar3) * 4);
    for (sum = 0.0; (int)sum < iVar3; sum = (float)((int)sum + 1)) {
      local_8c = 0.0;
      for (local_90 = 0; local_90 < iVar2; local_90 = local_90 + 1) {
        local_8c = *(float *)((long)pvVar4 + (long)local_90 * 4 + (long)(outptr._4_4_ * iVar2) * 4)
                   * *(float *)((long)pvVar5 + (long)local_90 * 4 + (long)((int)sum * iVar2) * 4) +
                   local_8c;
      }
      *ptrB = local_8c;
      ptrB = ptrB + 1;
    }
  }
  return;
}

Assistant:

static void matmul_transb(const Mat& A, const Mat& B, Mat& top_blob, const Option& opt)
{
    const int M = A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.h;

    const float* pA = A;
    const float* pB = B;
    float* pOut = top_blob;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = pA + i * K;
        float* outptr = pOut + i * N;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = pB + j * K;

            float sum = 0.f;
            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum;
        }
    }
}